

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

void ScaleRowDown38_3_Box_SSSE3
               (uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  uvec8 auVar66;
  uvec8 auVar67;
  uvec16 auVar68;
  int iVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined4 uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int dst_width_local;
  uint8_t *dst_ptr_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_ptr_local;
  
  auVar68 = libyuv::kScaleAc33;
  auVar67 = libyuv::kShufAc3;
  auVar66 = libyuv::kShufAc;
  do {
    auVar71 = *(undefined1 (*) [16])src_ptr;
    auVar70 = *(undefined1 (*) [16])(*(undefined1 (*) [16])src_ptr + src_stride);
    auVar72._8_8_ = in_XMM1._8_8_;
    auVar72._0_8_ = auVar71._8_8_;
    auVar77._8_8_ = in_XMM7._8_8_;
    auVar77._0_8_ = auVar70._8_8_;
    auVar11[0xd] = 0;
    auVar11._0_13_ = auVar71._0_13_;
    auVar11[0xe] = auVar71[7];
    auVar17[0xc] = auVar71[6];
    auVar17._0_12_ = auVar71._0_12_;
    auVar17._13_2_ = auVar11._13_2_;
    auVar23[0xb] = 0;
    auVar23._0_11_ = auVar71._0_11_;
    auVar23._12_3_ = auVar17._12_3_;
    auVar29[10] = auVar71[5];
    auVar29._0_10_ = auVar71._0_10_;
    auVar29._11_4_ = auVar23._11_4_;
    auVar35[9] = 0;
    auVar35._0_9_ = auVar71._0_9_;
    auVar35._10_5_ = auVar29._10_5_;
    auVar41[8] = auVar71[4];
    auVar41._0_8_ = auVar71._0_8_;
    auVar41._9_6_ = auVar35._9_6_;
    auVar48._7_8_ = 0;
    auVar48._0_7_ = auVar41._8_7_;
    auVar54._1_8_ = SUB158(auVar48 << 0x40,7);
    auVar54[0] = auVar71[3];
    auVar54._9_6_ = 0;
    auVar55._1_10_ = SUB1510(auVar54 << 0x30,5);
    auVar55[0] = auVar71[2];
    auVar55._11_4_ = 0;
    auVar73._3_12_ = SUB1512(auVar55 << 0x20,3);
    auVar73[2] = auVar71[1];
    auVar73[0] = auVar71[0];
    auVar73[1] = 0;
    auVar73[0xf] = 0;
    auVar6[0xd] = 0;
    auVar6._0_13_ = auVar72._0_13_;
    auVar6[0xe] = auVar71[0xf];
    auVar12[0xc] = auVar71[0xe];
    auVar12._0_12_ = auVar72._0_12_;
    auVar12._13_2_ = auVar6._13_2_;
    auVar18[0xb] = 0;
    auVar18._0_11_ = auVar72._0_11_;
    auVar18._12_3_ = auVar12._12_3_;
    auVar24[10] = auVar71[0xd];
    auVar24._0_10_ = auVar72._0_10_;
    auVar24._11_4_ = auVar18._11_4_;
    auVar30[9] = 0;
    auVar30._0_9_ = auVar72._0_9_;
    auVar30._10_5_ = auVar24._10_5_;
    auVar36[8] = auVar71[0xc];
    auVar36._0_8_ = auVar71._8_8_;
    auVar36._9_6_ = auVar30._9_6_;
    auVar49._7_8_ = 0;
    auVar49._0_7_ = auVar36._8_7_;
    auVar56._1_8_ = SUB158(auVar49 << 0x40,7);
    auVar56[0] = auVar71[0xb];
    auVar56._9_6_ = 0;
    auVar57._1_10_ = SUB1510(auVar56 << 0x30,5);
    auVar57[0] = auVar71[10];
    auVar57._11_4_ = 0;
    auVar43[2] = auVar71[9];
    auVar43._0_2_ = auVar71._8_2_;
    auVar43._3_12_ = SUB1512(auVar57 << 0x20,3);
    auVar71._0_2_ = auVar71._8_2_ & 0xff;
    auVar71._2_13_ = auVar43._2_13_;
    auVar71[0xf] = 0;
    auVar7[0xd] = 0;
    auVar7._0_13_ = auVar70._0_13_;
    auVar7[0xe] = auVar70[7];
    auVar13[0xc] = auVar70[6];
    auVar13._0_12_ = auVar70._0_12_;
    auVar13._13_2_ = auVar7._13_2_;
    auVar19[0xb] = 0;
    auVar19._0_11_ = auVar70._0_11_;
    auVar19._12_3_ = auVar13._12_3_;
    auVar25[10] = auVar70[5];
    auVar25._0_10_ = auVar70._0_10_;
    auVar25._11_4_ = auVar19._11_4_;
    auVar31[9] = 0;
    auVar31._0_9_ = auVar70._0_9_;
    auVar31._10_5_ = auVar25._10_5_;
    auVar37[8] = auVar70[4];
    auVar37._0_8_ = auVar70._0_8_;
    auVar37._9_6_ = auVar31._9_6_;
    auVar50._7_8_ = 0;
    auVar50._0_7_ = auVar37._8_7_;
    auVar58._1_8_ = SUB158(auVar50 << 0x40,7);
    auVar58[0] = auVar70[3];
    auVar58._9_6_ = 0;
    auVar59._1_10_ = SUB1510(auVar58 << 0x30,5);
    auVar59[0] = auVar70[2];
    auVar59._11_4_ = 0;
    auVar44[2] = auVar70[1];
    auVar44._0_2_ = auVar70._0_2_;
    auVar44._3_12_ = SUB1512(auVar59 << 0x20,3);
    auVar75._0_2_ = auVar70._0_2_ & 0xff;
    auVar75._2_13_ = auVar44._2_13_;
    auVar75[0xf] = 0;
    auVar8[0xd] = 0;
    auVar8._0_13_ = auVar77._0_13_;
    auVar8[0xe] = auVar70[0xf];
    auVar14[0xc] = auVar70[0xe];
    auVar14._0_12_ = auVar77._0_12_;
    auVar14._13_2_ = auVar8._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar77._0_11_;
    auVar20._12_3_ = auVar14._12_3_;
    auVar26[10] = auVar70[0xd];
    auVar26._0_10_ = auVar77._0_10_;
    auVar26._11_4_ = auVar20._11_4_;
    auVar32[9] = 0;
    auVar32._0_9_ = auVar77._0_9_;
    auVar32._10_5_ = auVar26._10_5_;
    auVar38[8] = auVar70[0xc];
    auVar38._0_8_ = auVar70._8_8_;
    auVar38._9_6_ = auVar32._9_6_;
    auVar51._7_8_ = 0;
    auVar51._0_7_ = auVar38._8_7_;
    auVar60._1_8_ = SUB158(auVar51 << 0x40,7);
    auVar60[0] = auVar70[0xb];
    auVar60._9_6_ = 0;
    auVar61._1_10_ = SUB1510(auVar60 << 0x30,5);
    auVar61[0] = auVar70[10];
    auVar61._11_4_ = 0;
    auVar45[2] = auVar70[9];
    auVar45._0_2_ = auVar70._8_2_;
    auVar45._3_12_ = SUB1512(auVar61 << 0x20,3);
    auVar78._0_2_ = auVar70._8_2_ & 0xff;
    auVar78._2_13_ = auVar45._2_13_;
    auVar78[0xf] = 0;
    auVar70 = paddusw(auVar73,auVar75);
    auVar73 = paddusw(auVar71,auVar78);
    auVar71 = *(undefined1 (*) [16])(*(undefined1 (*) [16])src_ptr + src_stride * 2);
    src_ptr = (uint8_t *)((long)src_ptr + 0x10);
    auVar42._8_7_ = auVar38._8_7_;
    auVar42._0_8_ = auVar71._8_8_;
    auVar9[0xd] = 0;
    auVar9._0_13_ = auVar71._0_13_;
    auVar9[0xe] = auVar71[7];
    auVar15[0xc] = auVar71[6];
    auVar15._0_12_ = auVar71._0_12_;
    auVar15._13_2_ = auVar9._13_2_;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar71._0_11_;
    auVar21._12_3_ = auVar15._12_3_;
    auVar27[10] = auVar71[5];
    auVar27._0_10_ = auVar71._0_10_;
    auVar27._11_4_ = auVar21._11_4_;
    auVar33[9] = 0;
    auVar33._0_9_ = auVar71._0_9_;
    auVar33._10_5_ = auVar27._10_5_;
    auVar39[8] = auVar71[4];
    auVar39._0_8_ = auVar71._0_8_;
    auVar39._9_6_ = auVar33._9_6_;
    auVar52._7_8_ = 0;
    auVar52._0_7_ = auVar39._8_7_;
    auVar62._1_8_ = SUB158(auVar52 << 0x40,7);
    auVar62[0] = auVar71[3];
    auVar62._9_6_ = 0;
    auVar63._1_10_ = SUB1510(auVar62 << 0x30,5);
    auVar63[0] = auVar71[2];
    auVar63._11_4_ = 0;
    auVar46[2] = auVar71[1];
    auVar46._0_2_ = auVar71._0_2_;
    auVar46._3_12_ = SUB1512(auVar63 << 0x20,3);
    auVar76._0_2_ = auVar71._0_2_ & 0xff;
    auVar76._2_13_ = auVar46._2_13_;
    auVar76[0xf] = 0;
    auVar10[0xd] = 0;
    auVar10._0_13_ = auVar42._0_13_;
    auVar10[0xe] = auVar71[0xf];
    auVar16[0xc] = auVar71[0xe];
    auVar16._0_12_ = auVar42._0_12_;
    auVar16._13_2_ = auVar10._13_2_;
    auVar22[0xb] = 0;
    auVar22._0_11_ = auVar42._0_11_;
    auVar22._12_3_ = auVar16._12_3_;
    auVar28[10] = auVar71[0xd];
    auVar28._0_10_ = auVar42._0_10_;
    auVar28._11_4_ = auVar22._11_4_;
    auVar34[9] = 0;
    auVar34._0_9_ = auVar42._0_9_;
    auVar34._10_5_ = auVar28._10_5_;
    auVar40[8] = auVar71[0xc];
    auVar40._0_8_ = auVar71._8_8_;
    auVar40._9_6_ = auVar34._9_6_;
    auVar53._7_8_ = 0;
    auVar53._0_7_ = auVar40._8_7_;
    auVar64._1_8_ = SUB158(auVar53 << 0x40,7);
    auVar64[0] = auVar71[0xb];
    auVar64._9_6_ = 0;
    auVar65._1_10_ = SUB1510(auVar64 << 0x30,5);
    auVar65[0] = auVar71[10];
    auVar65._11_4_ = 0;
    auVar47[2] = auVar71[9];
    auVar47._0_2_ = auVar71._8_2_;
    auVar47._3_12_ = SUB1512(auVar65 << 0x20,3);
    auVar79._0_2_ = auVar71._8_2_ & 0xff;
    auVar79._2_13_ = auVar47._2_13_;
    auVar79[0xf] = 0;
    auVar71 = paddusw(auVar70,auVar76);
    auVar70 = paddusw(auVar73,auVar79);
    auVar73 = paddusw(auVar71,auVar71 >> 0x10);
    auVar71 = paddusw(auVar73,auVar71 >> 0x20);
    auVar71 = pshufb(auVar71,(undefined1  [16])auVar66);
    auVar73 = paddusw(auVar70,auVar70 >> 0x10);
    in_XMM1 = auVar70 >> 0x20;
    auVar70 = paddusw(auVar73,in_XMM1);
    in_XMM7 = pshufb(auVar70,(undefined1  [16])auVar67);
    auVar71 = paddusw(auVar71,in_XMM7);
    auVar71 = pmulhuw(auVar71,(undefined1  [16])auVar68);
    sVar2 = auVar71._0_2_;
    sVar3 = auVar71._2_2_;
    sVar4 = auVar71._4_2_;
    sVar5 = auVar71._6_2_;
    uVar74 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar71[6] - (0xff < sVar5),
                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar71[4] - (0xff < sVar4),
                               CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar71[2] - (0xff < sVar3),
                                        (0 < sVar2) * (sVar2 < 0x100) * auVar71[0] - (0xff < sVar2))
                              ));
    sVar2 = auVar71._8_2_;
    sVar3 = auVar71._10_2_;
    *(undefined4 *)dst_ptr = uVar74;
    *(int *)(dst_ptr + 2) =
         (int)(CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar71[10] - (0xff < sVar3),
                        CONCAT14((0 < sVar2) * (sVar2 < 0x100) * auVar71[8] - (0xff < sVar2),uVar74)
                       ) >> 0x10);
    dst_ptr = dst_ptr + 6;
    iVar69 = dst_width + -6;
    bVar1 = 5 < dst_width;
    dst_width = iVar69;
  } while (iVar69 != 0 && bVar1);
  return;
}

Assistant:

void ScaleRowDown38_3_Box_SSSE3(const uint8_t* src_ptr,
                                ptrdiff_t src_stride,
                                uint8_t* dst_ptr,
                                int dst_width) {
  asm volatile(
      "movdqa      %0,%%xmm2                     \n"
      "movdqa      %1,%%xmm3                     \n"
      "movdqa      %2,%%xmm4                     \n"
      "pxor        %%xmm5,%%xmm5                 \n"
      :
      : "m"(kShufAc),    // %0
        "m"(kShufAc3),   // %1
        "m"(kScaleAc33)  // %2
  );
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x00(%0,%3,1),%%xmm6          \n"
      "movhlps     %%xmm0,%%xmm1                 \n"
      "movhlps     %%xmm6,%%xmm7                 \n"
      "punpcklbw   %%xmm5,%%xmm0                 \n"
      "punpcklbw   %%xmm5,%%xmm1                 \n"
      "punpcklbw   %%xmm5,%%xmm6                 \n"
      "punpcklbw   %%xmm5,%%xmm7                 \n"
      "paddusw     %%xmm6,%%xmm0                 \n"
      "paddusw     %%xmm7,%%xmm1                 \n"
      "movdqu      0x00(%0,%3,2),%%xmm6          \n"
      "lea         0x10(%0),%0                   \n"
      "movhlps     %%xmm6,%%xmm7                 \n"
      "punpcklbw   %%xmm5,%%xmm6                 \n"
      "punpcklbw   %%xmm5,%%xmm7                 \n"
      "paddusw     %%xmm6,%%xmm0                 \n"
      "paddusw     %%xmm7,%%xmm1                 \n"
      "movdqa      %%xmm0,%%xmm6                 \n"
      "psrldq      $0x2,%%xmm0                   \n"
      "paddusw     %%xmm0,%%xmm6                 \n"
      "psrldq      $0x2,%%xmm0                   \n"
      "paddusw     %%xmm0,%%xmm6                 \n"
      "pshufb      %%xmm2,%%xmm6                 \n"
      "movdqa      %%xmm1,%%xmm7                 \n"
      "psrldq      $0x2,%%xmm1                   \n"
      "paddusw     %%xmm1,%%xmm7                 \n"
      "psrldq      $0x2,%%xmm1                   \n"
      "paddusw     %%xmm1,%%xmm7                 \n"
      "pshufb      %%xmm3,%%xmm7                 \n"
      "paddusw     %%xmm7,%%xmm6                 \n"
      "pmulhuw     %%xmm4,%%xmm6                 \n"
      "packuswb    %%xmm6,%%xmm6                 \n"
      "movd        %%xmm6,(%1)                   \n"
      "psrlq       $0x10,%%xmm6                  \n"
      "movd        %%xmm6,0x2(%1)                \n"
      "lea         0x6(%1),%1                    \n"
      "sub         $0x6,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),               // %0
        "+r"(dst_ptr),               // %1
        "+r"(dst_width)              // %2
      : "r"((intptr_t)(src_stride))  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}